

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O1

void __thiscall
KeyData_FromStringExtPubkeyDerive_Test::~KeyData_FromStringExtPubkeyDerive_Test
          (KeyData_FromStringExtPubkeyDerive_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(KeyData, FromStringExtPubkeyDerive) {
  std::string key1 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/1/2";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003, 1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3'/1/2]038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003/0x1/0x2",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h/1/2]tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }

  // hardened error
  KeyData obj2;
  try {
    std::string key2 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/1h/2";
    obj2 = KeyData(key2);
    EXPECT_FALSE(true);
  } catch (const CfdException& e) {
    EXPECT_STREQ("Failed to extPubkey. hardened is extPrivkey only.", e.what());
  }
  try {
    std::string key3 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/0x80000001/2";
    obj2 = KeyData(key3);
    EXPECT_FALSE(true);
  } catch (const CfdException& e) {
    EXPECT_STREQ("Failed to extPubkey. hardened is extPrivkey only.", e.what());
  }
  try {
    std::string key4 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/2147483648/2";
    obj2 = KeyData(key4);
    EXPECT_FALSE(true);
  } catch (const CfdException& e) {
    EXPECT_STREQ("Failed to extPubkey. hardened is extPrivkey only.", e.what());
  }
}